

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O0

int Fxch_ManDivSingleCube(Fxch_Man_t *pFxchMan,int iCube,int fAdd,int fUpdate)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p;
  int *piVar5;
  int local_5c;
  int local_58;
  int z;
  int j;
  int nOnes;
  int *pOutputID;
  int fBase;
  int fSingleCube;
  int Lit1;
  int Lit0;
  int k;
  int i;
  Vec_Int_t *vCube;
  int fUpdate_local;
  int fAdd_local;
  int iCube_local;
  Fxch_Man_t *pFxchMan_local;
  
  p = Vec_WecEntry(pFxchMan->vCubes,iCube);
  iVar2 = Vec_IntSize(p);
  if (iVar2 < 2) {
    pFxchMan_local._4_4_ = 0;
  }
  else {
    for (Lit0 = 1; iVar2 = Vec_IntSize(p), Lit0 < iVar2; Lit0 = Lit0 + 1) {
      iVar2 = Vec_IntEntry(p,Lit0);
      Lit1 = Lit0;
      while( true ) {
        Lit1 = Lit1 + 1;
        iVar4 = Vec_IntSize(p);
        if (iVar4 <= Lit1) break;
        iVar4 = Vec_IntEntry(p,Lit1);
        if (iVar4 <= iVar2) {
          __assert_fail("Lit0 < Lit1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/FxchMan.c"
                        ,0x47,"int Fxch_ManDivSingleCube(Fxch_Man_t *, int, int, int)");
        }
        Vec_IntClear(pFxchMan->vCubeFree);
        pVVar1 = pFxchMan->vCubeFree;
        iVar3 = Abc_LitNot(iVar2);
        iVar3 = Abc_Var2Lit(iVar3,0);
        Vec_IntPush(pVVar1,iVar3);
        pVVar1 = pFxchMan->vCubeFree;
        iVar4 = Abc_LitNot(iVar4);
        iVar4 = Abc_Var2Lit(iVar4,1);
        Vec_IntPush(pVVar1,iVar4);
        piVar5 = Vec_IntEntryP(pFxchMan->vOutputID,iCube * pFxchMan->nSizeOutputID);
        z = 0;
        for (local_58 = 0; local_58 < pFxchMan->nSizeOutputID; local_58 = local_58 + 1) {
          iVar4 = Fxch_CountOnes(piVar5[local_58]);
          z = iVar4 + z;
        }
        if (z == 0) {
          z = 1;
        }
        if (fAdd == 0) {
          for (local_5c = 0; local_5c < z; local_5c = local_5c + 1) {
            Fxch_DivRemove(pFxchMan,fUpdate,1,0);
          }
          pFxchMan->nPairsS = pFxchMan->nPairsS + -1;
        }
        else {
          for (local_5c = 0; local_5c < z; local_5c = local_5c + 1) {
            Fxch_DivAdd(pFxchMan,fUpdate,1,0);
          }
          pFxchMan->nPairsS = pFxchMan->nPairsS + 1;
        }
      }
    }
    iVar2 = Vec_IntSize(p);
    iVar4 = Vec_IntSize(p);
    pFxchMan_local._4_4_ = (iVar2 * (iVar4 + -1)) / 2;
  }
  return pFxchMan_local._4_4_;
}

Assistant:

static inline int Fxch_ManDivSingleCube( Fxch_Man_t* pFxchMan,
                                         int iCube,
                                         int fAdd,
                                         int fUpdate )
{
    Vec_Int_t* vCube = Vec_WecEntry( pFxchMan->vCubes, iCube );
    int i, k,
        Lit0,
        Lit1,
        fSingleCube = 1,
        fBase = 0;

    if ( Vec_IntSize( vCube ) < 2 )
        return 0;

    Vec_IntForEachEntryStart( vCube, Lit0, i, 1)
    Vec_IntForEachEntryStart( vCube, Lit1, k, (i + 1) )
    {
        int * pOutputID, nOnes, j, z;
        assert( Lit0 < Lit1 );

        Vec_IntClear( pFxchMan->vCubeFree );
        Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( Abc_LitNot( Lit0 ), 0 ) );
        Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( Abc_LitNot( Lit1 ), 1 ) );

        pOutputID = Vec_IntEntryP( pFxchMan->vOutputID, iCube * pFxchMan->nSizeOutputID );
        nOnes = 0;

        for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
            nOnes += Fxch_CountOnes( pOutputID[j] );

        if ( nOnes == 0 )
            nOnes = 1;

        if (fAdd)
        {
            for ( z = 0; z < nOnes; z++ )
                Fxch_DivAdd( pFxchMan, fUpdate, fSingleCube, fBase );
            pFxchMan->nPairsS++;
        }
        else
        {
            for ( z = 0; z < nOnes; z++ )
                Fxch_DivRemove( pFxchMan, fUpdate, fSingleCube, fBase );
            pFxchMan->nPairsS--;
        }
    }

    return Vec_IntSize( vCube ) * ( Vec_IntSize( vCube ) - 1 ) / 2;
}